

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O2

size_t __thiscall
cappuccino::tlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::
insert_range<std::vector<std::tuple<std::chrono::duration<long,std::ratio<60l,1l>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::chrono::duration<long,std::ratio<60l,1l>>,unsigned_long,std::__cxx11::string>>>>
          (tlru_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1> *this,
          vector<std::tuple<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *key_value_range,allow a)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  time_point now;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> guard;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  std::mutex::lock((mutex *)this);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (key_value_range->
           super__Vector_base<std::tuple<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  sVar3 = 0;
  for (value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (key_value_range->
               super__Vector_base<std::tuple<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<60L,_1L>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; value != pbVar1;
      value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value[1].field_2
      ) {
    bVar2 = tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
            ::do_insert_update((tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                                *)this,(unsigned_long *)(value + 1),value,now,
                               (time_point)
                               (value[1]._M_string_length * 60000000000 + (long)now.__d.__r),a);
    sVar3 = sVar3 + bVar2;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return sVar3;
}

Assistant:

auto insert_range(range_type&& key_value_range, allow a = allow::insert_or_update) -> size_t
    {
        auto   now = std::chrono::steady_clock::now();
        size_t inserted{0};

        {
            std::lock_guard guard{m_lock};
            for (auto& [ttl, key, value] : key_value_range)
            {
                auto expired_time = now + ttl;
                if (do_insert_update(key, std::move(value), now, expired_time, a))
                {
                    ++inserted;
                }
            }
        }

        return inserted;
    }